

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O2

bool __thiscall
QAbstractItemView::edit
          (QAbstractItemView *this,QModelIndex *index,EditTrigger trigger,QEvent *event)

{
  EditTrigger EVar1;
  long lVar2;
  QAbstractItemViewPrivate *this_00;
  Data *pDVar3;
  Data *pDVar4;
  QWidget *this_01;
  QAbstractItemModel *pQVar5;
  bool bVar6;
  char cVar7;
  FocusPolicy FVar8;
  int msec;
  QEditorInfo *pQVar9;
  QEvent *event_00;
  long in_FS_OFFSET;
  QModelIndex local_70;
  QModelIndex local_58;
  QPersistentModelIndex safeIndex;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractItemViewPrivate **)(this + 8);
  bVar6 = QAbstractItemViewPrivate::isIndexValid(this_00,index);
  if (!bVar6) {
LAB_004e6022:
    bVar6 = false;
    goto LAB_004e6120;
  }
  pDVar3 = (this_00->persistent).q_hash.d;
  if ((pDVar3 != (Data *)0x0) && (pDVar3->size != 0)) {
    pQVar9 = QAbstractItemViewPrivate::editorForIndex(this_00,index);
    pDVar4 = (pQVar9->widget).wp.d;
    if ((pDVar4 != (Data *)0x0) &&
       ((*(int *)(pDVar4 + 4) != 0 &&
        (this_01 = (QWidget *)(pQVar9->widget).wp.value, this_01 != (QWidget *)0x0)))) {
      FVar8 = QWidget::focusPolicy(this_01);
      if (FVar8 != NoFocus) {
        if (this_00->waitForIMCommit == false) {
          QWidget::setFocus(this_01);
        }
        else {
          QWidget::updateMicroFocus((QWidget *)this,ImQueryAll);
        }
        bVar6 = true;
        goto LAB_004e6120;
      }
      goto LAB_004e6022;
    }
  }
  if (trigger == CurrentChanged) {
LAB_004e604b:
    QBasicTimer::stop();
  }
  else if (trigger == DoubleClicked) {
    QBasicTimer::stop();
    goto LAB_004e604b;
  }
  safeIndex.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
  QPersistentModelIndex::QPersistentModelIndex(&safeIndex,index);
  bVar6 = QAbstractItemViewPrivate::sendDelegateEvent(this_00,index,event);
  if (bVar6) {
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_58,&safeIndex);
    update(this,&local_58);
LAB_004e609c:
    bVar6 = true;
  }
  else {
    cVar7 = QPersistentModelIndex::isValid();
    if (cVar7 != '\0') {
      EVar1 = this_00->lastTrigger;
      this_00->lastTrigger = trigger;
      pQVar5 = this_00->model;
      QPersistentModelIndex::operator_cast_to_QModelIndex(&local_70,&safeIndex);
      (**(code **)(*(long *)pQVar5 + 0x148))(&local_58,pQVar5,&local_70);
      bVar6 = QAbstractItemViewPrivate::shouldEdit(this_00,trigger,&local_58);
      if (((bVar6) && ((this_00->delayedEditing).m_id == Invalid)) &&
         ((trigger != SelectedClicked || (EVar1 != DoubleClicked)))) {
        if (trigger == SelectedClicked) {
          msec = QApplication::doubleClickInterval();
          QBasicTimer::start(&this_00->delayedEditing,msec,(QObject *)this);
        }
        else {
          QPersistentModelIndex::operator_cast_to_QModelIndex(&local_58,&safeIndex);
          if ((event == (QEvent *)0x0) ||
             ((trigger &
              (this_00->editTriggers).super_QFlagsStorageHelper<QAbstractItemView::EditTrigger,_4>.
              super_QFlagsStorage<QAbstractItemView::EditTrigger>.i) != AnyKeyPressed)) {
            event_00 = (QEvent *)0x0;
          }
          else {
            event_00 = (QEvent *)0x0;
            if (*(ushort *)(event + 8) - 2 < 5) {
              event_00 = event;
            }
          }
          QAbstractItemViewPrivate::openEditor(this_00,&local_58,event_00);
        }
        goto LAB_004e609c;
      }
    }
    bVar6 = false;
  }
  QPersistentModelIndex::~QPersistentModelIndex(&safeIndex);
LAB_004e6120:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return bVar6;
}

Assistant:

bool QAbstractItemView::edit(const QModelIndex &index, EditTrigger trigger, QEvent *event)
{
    Q_D(QAbstractItemView);

    if (!d->isIndexValid(index))
        return false;

    if (QWidget *w = (d->persistent.isEmpty() ? static_cast<QWidget*>(nullptr) : d->editorForIndex(index).widget.data())) {
        if (w->focusPolicy() == Qt::NoFocus)
            return false;
        if (!d->waitForIMCommit)
            w->setFocus();
        else
            updateMicroFocus();
        return true;
    }

    if (trigger == DoubleClicked) {
        d->delayedEditing.stop();
        d->delayedAutoScroll.stop();
    } else if (trigger == CurrentChanged) {
        d->delayedEditing.stop();
    }

    // in case e.g. setData() triggers a reset()
    QPersistentModelIndex safeIndex(index);

    if (d->sendDelegateEvent(index, event)) {
        update(safeIndex);
        return true;
    }

    if (!safeIndex.isValid()) {
        return false;
    }

    // save the previous trigger before updating
    EditTriggers lastTrigger = d->lastTrigger;
    d->lastTrigger = trigger;

    if (!d->shouldEdit(trigger, d->model->buddy(safeIndex)))
        return false;

    if (d->delayedEditing.isActive())
        return false;

    // we will receive a mouseButtonReleaseEvent after a
    // mouseDoubleClickEvent, so we need to check the previous trigger
    if (lastTrigger == DoubleClicked && trigger == SelectedClicked)
        return false;

    // we may get a double click event later
    if (trigger == SelectedClicked)
        d->delayedEditing.start(QApplication::doubleClickInterval(), this);
    else
        d->openEditor(safeIndex, d->shouldForwardEvent(trigger, event) ? event : nullptr);

    return true;
}